

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  int *piVar1;
  ImDrawList *this;
  ImVec2 *pIVar2;
  float *pfVar3;
  ImGuiID IVar4;
  ImFontAtlas *pIVar5;
  ImGuiPopupRef *pIVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *pIVar8;
  byte bVar9;
  int i;
  int iVar10;
  int iVar11;
  ImGuiID IVar12;
  ImGuiTextBuffer *this_00;
  char *pcVar13;
  ImGuiIniData *pIVar14;
  long lVar15;
  ImGuiWindow *pIVar16;
  ImGuiWindow *pIVar17;
  ulong uVar18;
  ImGuiWindow **ppIVar19;
  ImGuiPopupRef *pIVar20;
  char cVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  ulong uVar25;
  ImGuiWindow **ppIVar26;
  ulong uVar27;
  char *pcVar28;
  char *pcVar29;
  uint uVar30;
  bool bVar31;
  ImVec2 IVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  ImVec2 IVar39;
  float fVar40;
  float y;
  int file_size;
  char name [64];
  float local_9c;
  ImGuiIniData *local_98;
  int local_90;
  int local_8c;
  char *local_88;
  ImGuiContext *local_80;
  ImVec2 local_78 [9];
  
  pIVar7 = GImGui;
  if ((GImGui->IO).DeltaTime < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x818,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x819,"void ImGui::NewFrame()");
  }
  pIVar5 = (GImGui->IO).Fonts;
  if ((pIVar5->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x81a,"void ImGui::NewFrame()");
  }
  if ((*(pIVar5->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x81b,"void ImGui::NewFrame()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x81c,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    this_00 = (ImGuiTextBuffer *)(*(pIVar7->IO).MemAllocFn)(0x10);
    pIVar7->LogClipboard = this_00;
    ImGuiTextBuffer::ImGuiTextBuffer(this_00);
    if ((pIVar7->Settings).Size != 0) {
      __assert_fail("g.Settings.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x824,"void ImGui::NewFrame()");
    }
    local_80 = GImGui;
    pcVar13 = (GImGui->IO).IniFilename;
    if ((pcVar13 != (char *)0x0) &&
       (pcVar13 = (char *)ImLoadFileToMemory(pcVar13,"rb",&local_8c,1), local_88 = pcVar13,
       pcVar13 != (char *)0x0)) {
      if (0 < (long)local_8c) {
        pcVar29 = pcVar13 + local_8c;
        pIVar14 = (ImGuiIniData *)0x0;
        pcVar28 = pcVar13;
LAB_00121a7b:
        do {
          if ((*pcVar13 != '\n') && (*pcVar13 != '\r')) {
            pcVar13 = pcVar13 + 1;
            if (pcVar13 < pcVar29) goto LAB_00121a7b;
          }
          if (((pcVar28 < pcVar13) && (*pcVar28 == '[')) && (pcVar13[-1] == ']')) {
            ImFormatString((char *)local_78,0x40,"%.*s",(ulong)(((int)pcVar13 - (int)pcVar28) - 2),
                           pcVar28 + 1);
            pIVar14 = FindWindowSettings((char *)local_78);
            if (pIVar14 == (ImGuiIniData *)0x0) {
              pIVar14 = AddWindowSettings((char *)local_78);
            }
          }
          else if (pIVar14 == (ImGuiIniData *)0x0) {
            pIVar14 = (ImGuiIniData *)0x0;
          }
          else {
            local_98 = pIVar14;
            iVar10 = __isoc99_sscanf(pcVar28,"Pos=%f,%f",local_78);
            if (iVar10 == 2) {
              (local_98->Pos).x = local_78[0].x;
              (local_98->Pos).y = local_9c;
              pIVar14 = local_98;
            }
            else {
              iVar10 = __isoc99_sscanf(pcVar28,"Size=%f,%f",local_78,&local_9c);
              if (iVar10 == 2) {
                fVar36 = (local_80->Style).WindowMinSize.x;
                fVar34 = (local_80->Style).WindowMinSize.y;
                uVar22 = -(uint)(fVar36 <= local_78[0].x);
                IVar39.x = (float)(~uVar22 & (uint)fVar36 | (uint)local_78[0].x & uVar22);
                uVar22 = -(uint)(fVar34 <= local_9c);
                IVar39.y = (float)(~uVar22 & (uint)fVar34 | (uint)local_9c & uVar22);
                local_98->Size = IVar39;
                pIVar14 = local_98;
              }
              else {
                iVar10 = __isoc99_sscanf(pcVar28,"Collapsed=%d",&local_90);
                pIVar14 = local_98;
                if (iVar10 == 1) {
                  local_98->Collapsed = local_90 != 0;
                }
              }
            }
          }
          pcVar13 = pcVar13 + 1;
          pcVar28 = pcVar13;
        } while (pcVar13 < pcVar29);
      }
      pIVar8 = GImGui;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar8->IO).MemFreeFn)(local_88);
    }
    pIVar7->Initialized = true;
  }
  pIVar5 = (pIVar7->IO).Fonts;
  if ((pIVar5->Fonts).Size < 1) {
    pcVar13 = "value_type &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_00122903:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                  ,0x35b,pcVar13);
  }
  SetCurrentFont(*(pIVar5->Fonts).Data);
  pIVar7->Time = (pIVar7->IO).DeltaTime + pIVar7->Time;
  pIVar7->FrameCount = pIVar7->FrameCount + 1;
  pIVar7->Tooltip[0] = '\0';
  this = &pIVar7->OverlayDrawList;
  ImDrawList::Clear(this);
  ImDrawList::PushTextureID(this,&((pIVar7->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(this);
  (pIVar7->RenderDrawData).Valid = false;
  (pIVar7->RenderDrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar7->RenderDrawData).CmdListsCount = 0;
  (pIVar7->RenderDrawData).TotalVtxCount = 0;
  (pIVar7->RenderDrawData).TotalIdxCount = 0;
  pIVar2 = &(pIVar7->IO).MousePos;
  if ((pIVar2->x <= 0.0 && pIVar2->x != 0.0) &&
     (pfVar3 = &(pIVar7->IO).MousePos.y, *pfVar3 <= 0.0 && *pfVar3 != 0.0)) {
    (pIVar7->IO).MousePos.x = -9999.0;
    (pIVar7->IO).MousePos.y = -9999.0;
  }
  fVar36 = (pIVar7->IO).MousePos.x;
  if (((fVar36 < 0.0) && (pfVar3 = &(pIVar7->IO).MousePos.y, *pfVar3 <= 0.0 && *pfVar3 != 0.0)) ||
     ((fVar34 = (pIVar7->IO).MousePosPrev.x, fVar34 < 0.0 &&
      (pfVar3 = &(pIVar7->IO).MousePosPrev.y, *pfVar3 <= 0.0 && *pfVar3 != 0.0)))) {
    (pIVar7->IO).MouseDelta.x = 0.0;
    (pIVar7->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar32.x = fVar36 - fVar34;
    IVar32.y = (pIVar7->IO).MousePos.y - (pIVar7->IO).MousePosPrev.y;
    (pIVar7->IO).MouseDelta = IVar32;
  }
  (pIVar7->IO).MousePosPrev = (pIVar7->IO).MousePos;
  lVar15 = 0x3a5;
  do {
    cVar21 = *(char *)((long)pIVar7 + lVar15 + -0x2a5);
    if (cVar21 == '\x01') {
      pfVar3 = (float *)((long)pIVar7 + lVar15 * 4 + -0xae4);
      bVar31 = *pfVar3 <= 0.0 && *pfVar3 != 0.0;
    }
    else {
      bVar31 = false;
    }
    *(bool *)((long)(pIVar7->IO).KeyMap + lVar15 + -0x7d) = bVar31;
    if (cVar21 == '\0') {
      bVar24 = 0.0 <= *(float *)((long)pIVar7 + lVar15 * 4 + -0xae4);
    }
    else {
      bVar24 = false;
    }
    *(bool *)((long)(pIVar7->IO).KeyMap + lVar15 + -0x34) = bVar24;
    fVar36 = *(float *)((long)pIVar7 + lVar15 * 4 + -0xae4);
    *(float *)((long)pIVar7 + lVar15 * 4 + -0xad0) = fVar36;
    fVar34 = -1.0;
    if ((cVar21 != '\0') && (fVar34 = 0.0, 0.0 <= fVar36)) {
      fVar34 = fVar36 + (pIVar7->IO).DeltaTime;
    }
    *(float *)((long)pIVar7 + lVar15 * 4 + -0xae4) = fVar34;
    *(undefined1 *)((long)(pIVar7->IO).KeyMap + lVar15 + -0x39) = 0;
    if (bVar31 == false) {
      if (cVar21 != '\0') {
        fVar36 = *(float *)((long)pIVar7 + lVar15 * 4 + -0xabc);
        fVar34 = (pIVar7->IO).MousePos.x - *(float *)((long)pIVar7 + lVar15 * 8 + -0x19c4);
        fVar35 = (pIVar7->IO).MousePos.y - *(float *)((long)pIVar7 + lVar15 * 8 + -0x19c0);
        fVar34 = fVar34 * fVar34 + fVar35 * fVar35;
        uVar22 = -(uint)(fVar34 <= fVar36);
        *(uint *)((long)pIVar7 + lVar15 * 4 + -0xabc) =
             uVar22 & (uint)fVar36 | ~uVar22 & (uint)fVar34;
      }
    }
    else {
      fVar36 = pIVar7->Time;
      if ((fVar36 - *(float *)((long)pIVar7 + lVar15 * 4 + -0xb08) <
           (pIVar7->IO).MouseDoubleClickTime) &&
         (fVar35 = (pIVar7->IO).MousePos.x - *(float *)((long)pIVar7 + lVar15 * 8 + -0x19c4),
         fVar37 = (pIVar7->IO).MousePos.y - *(float *)((long)pIVar7 + lVar15 * 8 + -0x19c0),
         fVar34 = (pIVar7->IO).MouseDoubleClickMaxDist, fVar36 = -3.4028235e+38,
         fVar35 * fVar35 + fVar37 * fVar37 < fVar34 * fVar34)) {
        *(undefined1 *)((long)(pIVar7->IO).KeyMap + lVar15 + -0x39) = 1;
        fVar36 = -3.4028235e+38;
      }
      *(float *)((long)pIVar7 + lVar15 * 4 + -0xb08) = fVar36;
      *(ImVec2 *)((long)pIVar7 + lVar15 * 8 + -0x19c4) = (pIVar7->IO).MousePos;
      *(undefined4 *)((long)pIVar7 + lVar15 * 4 + -0xabc) = 0;
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x3aa);
  pfVar3 = (pIVar7->IO).KeysDownDuration;
  memcpy((pIVar7->IO).KeysDownDurationPrev,pfVar3,0x800);
  lVar15 = 0;
  do {
    fVar36 = -1.0;
    if ((pIVar7->IO).KeysDown[lVar15] == true) {
      fVar36 = 0.0;
      if (0.0 <= pfVar3[lVar15]) {
        fVar36 = pfVar3[lVar15] + (pIVar7->IO).DeltaTime;
      }
    }
    pfVar3[lVar15] = fVar36;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x200);
  fVar36 = (pIVar7->IO).DeltaTime;
  iVar10 = pIVar7->FramerateSecPerFrameIdx;
  pIVar7->FramerateSecPerFrameAccum =
       (fVar36 - pIVar7->FramerateSecPerFrame[iVar10]) + pIVar7->FramerateSecPerFrameAccum;
  pIVar7->FramerateSecPerFrame[iVar10] = fVar36;
  iVar11 = iVar10 + (int)((ulong)((long)(iVar10 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar7->FramerateSecPerFrameIdx = iVar10 + 1 + ((iVar11 >> 6) - (iVar11 >> 0x1f)) * -0x78;
  (pIVar7->IO).Framerate = 1.0 / (pIVar7->FramerateSecPerFrameAccum / 120.0);
  pIVar7->HoveredIdPreviousFrame = pIVar7->HoveredId;
  pIVar7->HoveredId = 0;
  pIVar7->HoveredIdAllowOverlap = false;
  pIVar8 = GImGui;
  if ((pIVar7->ActiveIdIsAlive == false) &&
     (pIVar7->ActiveId != 0 && pIVar7->ActiveIdPreviousFrame == pIVar7->ActiveId)) {
    GImGui->ActiveId = 0;
    pIVar8->ActiveIdIsJustActivated = true;
    pIVar8->ActiveIdAllowOverlap = false;
    pIVar8->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  IVar12 = pIVar7->ActiveId;
  IVar4 = pIVar7->MovedWindowMoveId;
  pIVar7->ActiveIdPreviousFrame = IVar12;
  pIVar7->ActiveIdIsAlive = false;
  pIVar8 = GImGui;
  pIVar7->ActiveIdIsJustActivated = false;
  if (IVar4 == IVar12 && IVar4 != 0) {
    if (GImGui->ActiveId == IVar4) {
      GImGui->ActiveIdIsAlive = true;
    }
    pIVar17 = pIVar7->MovedWindow;
    if ((pIVar17 == (ImGuiWindow *)0x0) || (pIVar17->RootWindow == (ImGuiWindow *)0x0)) {
      __assert_fail("g.MovedWindow && g.MovedWindow->RootWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x872,"void ImGui::NewFrame()");
    }
    if (pIVar17->RootWindow->MoveId != IVar4) {
      __assert_fail("g.MovedWindow->RootWindow->MoveId == g.MovedWindowMoveId",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x873,"void ImGui::NewFrame()");
    }
    if ((pIVar7->IO).MouseDown[0] == true) {
      uVar22 = pIVar17->Flags;
      if ((uVar22 & 4) == 0) {
        (pIVar17->PosFloat).x = (pIVar7->IO).MouseDelta.x + (pIVar17->PosFloat).x;
        (pIVar17->PosFloat).y = (pIVar7->IO).MouseDelta.y + (pIVar17->PosFloat).y;
        if (((uVar22 >> 8 & 1) == 0) && (pIVar8->SettingsDirtyTimer <= 0.0)) {
          pIVar8->SettingsDirtyTimer = (pIVar8->IO).IniSavingRate;
        }
      }
      FocusWindow(pIVar17);
    }
    else {
      pIVar8->ActiveId = 0;
      pIVar8->ActiveIdIsJustActivated = true;
      pIVar8->ActiveIdAllowOverlap = false;
      pIVar8->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar7->MovedWindow = (ImGuiWindow *)0x0;
      pIVar7->MovedWindowMoveId = 0;
    }
  }
  else {
    pIVar7->MovedWindow = (ImGuiWindow *)0x0;
    pIVar7->MovedWindowMoveId = 0;
  }
  if ((0.0 < pIVar7->SettingsDirtyTimer) &&
     (fVar36 = pIVar7->SettingsDirtyTimer - (pIVar7->IO).DeltaTime,
     pIVar7->SettingsDirtyTimer = fVar36, fVar36 <= 0.0)) {
    SaveSettings();
  }
  pIVar17 = pIVar7->MovedWindow;
  pIVar16 = pIVar17;
  if (pIVar17 == (ImGuiWindow *)0x0) {
    pIVar16 = FindHoveredWindow((pIVar7->IO).MousePos,false);
  }
  pIVar7->HoveredWindow = pIVar16;
  if ((pIVar16 == (ImGuiWindow *)0x0) || ((pIVar16->Flags & 0x100000) == 0)) {
    if (pIVar17 == (ImGuiWindow *)0x0) {
      pIVar17 = FindHoveredWindow((pIVar7->IO).MousePos,true);
    }
    else {
      pIVar17 = pIVar17->RootWindow;
    }
  }
  else {
    pIVar17 = pIVar16->RootWindow;
  }
  ppIVar26 = &pIVar7->HoveredWindow;
  pIVar7->HoveredRootWindow = pIVar17;
  pIVar17 = GetFrontMostModalRootWindow();
  if (pIVar17 == (ImGuiWindow *)0x0) {
    pIVar7->ModalWindowDarkeningRatio = 0.0;
  }
  else {
    fVar36 = (pIVar7->IO).DeltaTime * 6.0 + pIVar7->ModalWindowDarkeningRatio;
    if (1.0 <= fVar36) {
      fVar36 = 1.0;
    }
    pIVar7->ModalWindowDarkeningRatio = fVar36;
    ppIVar19 = &pIVar7->HoveredRootWindow;
    do {
      pIVar16 = *ppIVar19;
      if (pIVar16 == (ImGuiWindow *)0x0) break;
      ppIVar19 = &pIVar16->ParentWindow;
    } while (pIVar16 != pIVar17);
    if (pIVar16 == (ImGuiWindow *)0x0) {
      *(undefined4 *)ppIVar26 = 0;
      *(undefined4 *)((long)&pIVar7->HoveredWindow + 4) = 0;
      *(undefined4 *)&pIVar7->HoveredRootWindow = 0;
      *(undefined4 *)((long)&pIVar7->HoveredRootWindow + 4) = 0;
    }
  }
  iVar10 = -1;
  lVar15 = 0;
  bVar9 = 0;
  do {
    if ((pIVar7->IO).MouseClicked[lVar15] == true) {
      bVar31 = true;
      if (*ppIVar26 == (ImGuiWindow *)0x0) {
        bVar31 = (pIVar7->OpenPopupStack).Size != 0;
      }
      (pIVar7->IO).MouseDownOwned[lVar15] = bVar31;
    }
    bVar31 = (pIVar7->IO).MouseDown[lVar15];
    if ((bVar31 == true) &&
       ((iVar10 == -1 ||
        (fVar36 = (pIVar7->IO).MouseClickedTime[iVar10],
        pfVar3 = (pIVar7->IO).MouseClickedTime + lVar15, *pfVar3 <= fVar36 && fVar36 != *pfVar3))))
    {
      iVar10 = (int)lVar15;
    }
    bVar9 = bVar9 & 1 | bVar31;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 5);
  if (iVar10 == -1) {
    cVar21 = '\x01';
  }
  else {
    cVar21 = (pIVar7->IO).MouseDownOwned[iVar10];
  }
  if (pIVar7->CaptureMouseNextFrame == -1) {
    if (((cVar21 == '\0') || ((bVar31 = true, *ppIVar26 == (ImGuiWindow *)0x0 && (bVar9 == 0)))) &&
       (bVar31 = true, pIVar7->ActiveId == 0)) {
      bVar31 = (pIVar7->OpenPopupStack).Size != 0;
    }
    (pIVar7->IO).WantCaptureMouse = bVar31;
  }
  else {
    (pIVar7->IO).WantCaptureMouse = pIVar7->CaptureMouseNextFrame != 0;
  }
  IVar12 = pIVar7->CaptureKeyboardNextFrame;
  if (IVar12 == 0xffffffff) {
    IVar12 = pIVar7->ActiveId;
  }
  (pIVar7->IO).WantCaptureKeyboard = IVar12 != 0;
  if (pIVar7->ActiveId == 0) {
    bVar31 = false;
  }
  else {
    bVar31 = (pIVar7->InputTextState).Id == pIVar7->ActiveId;
  }
  (pIVar7->IO).WantTextInput = bVar31;
  pIVar7->MouseCursor = 0;
  pIVar7->CaptureMouseNextFrame = -1;
  pIVar7->CaptureKeyboardNextFrame = -1;
  (pIVar7->OsImePosRequest).x = 1.0;
  (pIVar7->OsImePosRequest).y = 1.0;
  if (cVar21 == '\0') {
    *ppIVar26 = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
  pIVar17 = *ppIVar26;
  if (pIVar17 != (ImGuiWindow *)0x0) {
    fVar36 = (pIVar7->IO).MouseWheel;
    if (((fVar36 != 0.0) || (NAN(fVar36))) && (pIVar17->Collapsed == false)) {
      if ((pIVar7->IO).KeyCtrl == true) {
        if ((pIVar7->IO).FontAllowUserScaling == true) {
          fVar34 = fVar36 * 0.1 + pIVar17->FontWindowScale;
          fVar36 = 2.5;
          if (fVar34 <= 2.5) {
            fVar36 = fVar34;
          }
          fVar36 = (float)(-(uint)(fVar34 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar34 < 0.5) & (uint)fVar36);
          fVar33 = fVar36 / pIVar17->FontWindowScale;
          pIVar17->FontWindowScale = fVar36;
          fVar36 = (pIVar17->Size).x;
          fVar34 = (pIVar17->Size).y;
          fVar35 = (pIVar17->Pos).x;
          fVar37 = (pIVar17->Pos).y;
          fVar38 = (((pIVar7->IO).MousePos.x - fVar35) * fVar36 * (1.0 - fVar33)) / fVar36;
          fVar40 = (((pIVar7->IO).MousePos.y - fVar37) * (1.0 - fVar33) * fVar34) / fVar34;
          (pIVar17->Pos).x = fVar35 + fVar38;
          (pIVar17->Pos).y = fVar37 + fVar40;
          (pIVar17->PosFloat).x = fVar38 + (pIVar17->PosFloat).x;
          (pIVar17->PosFloat).y = fVar40 + (pIVar17->PosFloat).y;
          (pIVar17->Size).x = fVar36 * fVar33;
          (pIVar17->Size).y = fVar34 * fVar33;
          (pIVar17->SizeFull).x = (pIVar17->SizeFull).x * fVar33;
          (pIVar17->SizeFull).y = fVar33 * (pIVar17->SizeFull).y;
        }
      }
      else if ((pIVar17->Flags & 0x10U) == 0) {
        fVar34 = (pIVar17->Scroll).y;
        fVar35 = (pIVar17->DC).CursorMaxPos.y;
        fVar36 = fVar34 - GImGui->FontBaseSize * pIVar17->FontWindowScale * fVar36 *
                          (float)(byte)((((uint)pIVar17->Flags >> 0x17 & 1) == 0) * '\x02' + 3);
        (pIVar17->Scroll).y = fVar36;
        (pIVar17->DC).CursorMaxPos.y = (fVar34 + fVar35) - fVar36;
      }
    }
  }
  if (((pIVar7->ActiveId == 0) && (pIVar7->FocusedWindow != (ImGuiWindow *)0x0)) &&
     ((pIVar7->FocusedWindow->Active == true &&
      (bVar31 = IsKeyPressed((GImGui->IO).KeyMap[0],false), bVar31)))) {
    pIVar7->FocusedWindow->FocusIdxTabRequestNext = 0;
  }
  uVar22 = (pIVar7->Windows).Size;
  uVar18 = (ulong)uVar22;
  if (uVar18 != 0) {
    uVar23 = 0;
    if (0 < (int)uVar22) {
      uVar23 = (ulong)uVar22;
    }
    uVar25 = 0;
    do {
      if (uVar23 == uVar25) {
        pcVar13 = "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_00122903;
      }
      pIVar17 = (pIVar7->Windows).Data[uVar25];
      pIVar17->WasActive = pIVar17->Active;
      pIVar17->Active = false;
      pIVar17->Accessed = false;
      uVar25 = uVar25 + 1;
    } while (uVar18 != uVar25);
  }
  if (((pIVar7->FocusedWindow != (ImGuiWindow *)0x0) && (0 < (int)uVar22)) &&
     (pIVar7->FocusedWindow->WasActive == false)) {
    lVar15 = uVar18 + 1;
    do {
      pIVar17 = (pIVar7->Windows).Data[lVar15 + -2];
      if ((pIVar17->WasActive == true) && ((pIVar17->Flags & 0x100000) == 0)) {
        FocusWindow(pIVar17);
        break;
      }
      lVar15 = lVar15 + -1;
    } while (1 < lVar15);
  }
  pIVar8 = GImGui;
  iVar10 = (pIVar7->CurrentWindowStack).Capacity;
  if (iVar10 < 0) {
    uVar22 = iVar10 / 2 + iVar10;
    uVar18 = 0;
    if (0 < (int)uVar22) {
      uVar18 = (ulong)uVar22;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    ppIVar19 = (ImGuiWindow **)(*(pIVar8->IO).MemAllocFn)(uVar18 * 8);
    ppIVar26 = (pIVar7->CurrentWindowStack).Data;
    if (ppIVar26 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar19,ppIVar26,(long)(pIVar7->CurrentWindowStack).Size << 3);
    }
    ppIVar26 = (pIVar7->CurrentWindowStack).Data;
    if (ppIVar26 != (ImGuiWindow **)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(ppIVar26);
    (pIVar7->CurrentWindowStack).Data = ppIVar19;
    (pIVar7->CurrentWindowStack).Capacity = (int)uVar18;
  }
  (pIVar7->CurrentWindowStack).Size = 0;
  pIVar8 = GImGui;
  iVar10 = (pIVar7->CurrentPopupStack).Capacity;
  if (iVar10 < 0) {
    uVar22 = iVar10 / 2 + iVar10;
    uVar18 = 0;
    if (0 < (int)uVar22) {
      uVar18 = (ulong)uVar22;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar20 = (ImGuiPopupRef *)(*(pIVar8->IO).MemAllocFn)(uVar18 * 0x28);
    pIVar6 = (pIVar7->CurrentPopupStack).Data;
    if (pIVar6 != (ImGuiPopupRef *)0x0) {
      memcpy(pIVar20,pIVar6,(long)(pIVar7->CurrentPopupStack).Size * 0x28);
    }
    pIVar6 = (pIVar7->CurrentPopupStack).Data;
    if (pIVar6 != (ImGuiPopupRef *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(pIVar6);
    (pIVar7->CurrentPopupStack).Data = pIVar20;
    (pIVar7->CurrentPopupStack).Capacity = (int)uVar18;
  }
  (pIVar7->CurrentPopupStack).Size = 0;
  pIVar7 = GImGui;
  uVar22 = (GImGui->OpenPopupStack).Size;
  uVar18 = (ulong)uVar22;
  if (uVar18 != 0) {
    uVar23 = 0;
    if (0 < (int)uVar22 && GImGui->FocusedWindow != (ImGuiWindow *)0x0) {
      pIVar6 = (GImGui->OpenPopupStack).Data;
      ppIVar26 = &pIVar6->Window;
      uVar25 = 1;
      uVar23 = 0;
      do {
        pIVar17 = pIVar6[uVar23].Window;
        if (pIVar17 != (ImGuiWindow *)0x0) {
          uVar30 = pIVar17->Flags;
          if ((uVar30 >> 0x19 & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                          ,0xd42,"void CloseInactivePopups()");
          }
          ppIVar19 = ppIVar26;
          uVar27 = uVar25;
          if ((uVar30 >> 0x14 & 1) == 0) {
            do {
              if (*ppIVar19 == (ImGuiWindow *)0x0) {
                bVar31 = false;
              }
              else {
                bVar31 = (*ppIVar19)->RootWindow == GImGui->FocusedWindow->RootWindow;
              }
              if (uVar18 <= uVar27) break;
              uVar27 = uVar27 + 1;
              ppIVar19 = ppIVar19 + 5;
            } while (!bVar31);
            if (!bVar31) goto LAB_00122780;
          }
        }
        uVar23 = uVar23 + 1;
        uVar25 = uVar25 + 1;
        ppIVar26 = ppIVar26 + 5;
      } while (uVar23 != uVar18);
      uVar23 = (ulong)uVar22;
    }
LAB_00122780:
    uVar30 = (uint)uVar23;
    if ((int)uVar30 < (int)uVar22) {
      iVar10 = (GImGui->OpenPopupStack).Capacity;
      if (iVar10 < (int)uVar30) {
        if (iVar10 == 0) {
          uVar22 = 8;
        }
        else {
          uVar22 = iVar10 / 2 + iVar10;
        }
        if ((int)uVar22 <= (int)uVar30) {
          uVar22 = uVar30;
        }
        if (iVar10 < (int)uVar22) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          pIVar20 = (ImGuiPopupRef *)(*(pIVar7->IO).MemAllocFn)((ulong)uVar22 * 0x28);
          pIVar6 = (pIVar7->OpenPopupStack).Data;
          if (pIVar6 != (ImGuiPopupRef *)0x0) {
            memcpy(pIVar20,pIVar6,(long)(pIVar7->OpenPopupStack).Size * 0x28);
          }
          pIVar6 = (pIVar7->OpenPopupStack).Data;
          if (pIVar6 != (ImGuiPopupRef *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pIVar6);
          (pIVar7->OpenPopupStack).Data = pIVar20;
          (pIVar7->OpenPopupStack).Capacity = uVar22;
        }
      }
      (pIVar7->OpenPopupStack).Size = uVar30;
    }
  }
  pIVar7 = GImGui;
  (pIVar7->SetNextWindowSizeVal).x = 400.0;
  (pIVar7->SetNextWindowSizeVal).y = 400.0;
  pIVar7->SetNextWindowSizeCond = 4;
  local_78[0].x = 0.0;
  local_78[0].y = 0.0;
  Begin("Debug",(bool *)0x0,local_78,-1.0,0);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    ImGuiContext& g = *GImGui;

    // Check user data
    IM_ASSERT(g.IO.DeltaTime >= 0.0f);               // Need a positive DeltaTime (zero is tolerated but will cause some timing issues)
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f);
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0);           // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded());     // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f);  // Invalid style setting

    if (!g.Initialized)
    {
        // Initialize on first frame
        g.LogClipboard = (ImGuiTextBuffer*)ImGui::MemAlloc(sizeof(ImGuiTextBuffer));
        IM_PLACEMENT_NEW(g.LogClipboard) ImGuiTextBuffer();

        IM_ASSERT(g.Settings.empty());
        LoadSettings();
        g.Initialized = true;
    }

    SetCurrentFont(g.IO.Fonts->Fonts[0]);

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.Tooltip[0] = '\0';
    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.RenderDrawData.Valid = false;
    g.RenderDrawData.CmdLists = NULL;
    g.RenderDrawData.CmdListsCount = g.RenderDrawData.TotalVtxCount = g.RenderDrawData.TotalIdxCount = 0;

    // Update inputs state
    if (g.IO.MousePos.x < 0 && g.IO.MousePos.y < 0)
        g.IO.MousePos = ImVec2(-9999.0f, -9999.0f);
    if ((g.IO.MousePos.x < 0 && g.IO.MousePos.y < 0) || (g.IO.MousePosPrev.x < 0 && g.IO.MousePosPrev.y < 0))   // if mouse just appeared or disappeared (negative coordinate) we cancel out movement in MouseDelta
        g.IO.MouseDelta = ImVec2(0.0f, 0.0f);
    else
        g.IO.MouseDelta = g.IO.MousePos - g.IO.MousePosPrev;
    g.IO.MousePosPrev = g.IO.MousePos;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        g.IO.MouseClicked[i] = g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] < 0.0f;
        g.IO.MouseReleased[i] = !g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] >= 0.0f;
        g.IO.MouseDownDurationPrev[i] = g.IO.MouseDownDuration[i];
        g.IO.MouseDownDuration[i] = g.IO.MouseDown[i] ? (g.IO.MouseDownDuration[i] < 0.0f ? 0.0f : g.IO.MouseDownDuration[i] + g.IO.DeltaTime) : -1.0f;
        g.IO.MouseDoubleClicked[i] = false;
        if (g.IO.MouseClicked[i])
        {
            if (g.Time - g.IO.MouseClickedTime[i] < g.IO.MouseDoubleClickTime)
            {
                if (ImLengthSqr(g.IO.MousePos - g.IO.MouseClickedPos[i]) < g.IO.MouseDoubleClickMaxDist * g.IO.MouseDoubleClickMaxDist)
                    g.IO.MouseDoubleClicked[i] = true;
                g.IO.MouseClickedTime[i] = -FLT_MAX;    // so the third click isn't turned into a double-click
            }
            else
            {
                g.IO.MouseClickedTime[i] = g.Time;
            }
            g.IO.MouseClickedPos[i] = g.IO.MousePos;
            g.IO.MouseDragMaxDistanceSqr[i] = 0.0f;
        }
        else if (g.IO.MouseDown[i])
        {
            g.IO.MouseDragMaxDistanceSqr[i] = ImMax(g.IO.MouseDragMaxDistanceSqr[i], ImLengthSqr(g.IO.MousePos - g.IO.MouseClickedPos[i]));
        }
    }
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = 1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame));

    // Clear reference to active widget if the widget isn't alive anymore
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        SetActiveID(0);
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;

    // Handle user moving window (at the beginning of the frame to avoid input lag or sheering). Only valid for root windows.
    if (g.MovedWindowMoveId && g.MovedWindowMoveId == g.ActiveId)
    {
        KeepAliveID(g.MovedWindowMoveId);
        IM_ASSERT(g.MovedWindow && g.MovedWindow->RootWindow);
        IM_ASSERT(g.MovedWindow->RootWindow->MoveId == g.MovedWindowMoveId);
        if (g.IO.MouseDown[0])
        {
            if (!(g.MovedWindow->Flags & ImGuiWindowFlags_NoMove))
            {
                g.MovedWindow->PosFloat += g.IO.MouseDelta;
                if (!(g.MovedWindow->Flags & ImGuiWindowFlags_NoSavedSettings))
                    MarkSettingsDirty();
            }
            FocusWindow(g.MovedWindow);
        }
        else
        {
            SetActiveID(0);
            g.MovedWindow = NULL;
            g.MovedWindowMoveId = 0;
        }
    }
    else
    {
        g.MovedWindow = NULL;
        g.MovedWindowMoveId = 0;
    }

    // Delay saving settings so we don't spam disk too much
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
            SaveSettings();
    }

    // Find the window we are hovering. Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow
    g.HoveredWindow = g.MovedWindow ? g.MovedWindow : FindHoveredWindow(g.IO.MousePos, false);
    if (g.HoveredWindow && (g.HoveredWindow->Flags & ImGuiWindowFlags_ChildWindow))
        g.HoveredRootWindow = g.HoveredWindow->RootWindow;
    else
        g.HoveredRootWindow = g.MovedWindow ? g.MovedWindow->RootWindow : FindHoveredWindow(g.IO.MousePos, true);

    if (ImGuiWindow* modal_window = GetFrontMostModalRootWindow())
    {
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
        ImGuiWindow* window = g.HoveredRootWindow;
        while (window && window != modal_window)
            window = window->ParentWindow;
        if (!window)
            g.HoveredRootWindow = g.HoveredWindow = NULL;
    }
    else
    {
        g.ModalWindowDarkeningRatio = 0.0f;
    }

    // Are we using inputs? Tell user so they can capture/discard the inputs away from the rest of their application.
    // When clicking outside of a window we assume the click is owned by the application and won't request capture. We need to track click ownership.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[mouse_earliest_button_down] > g.IO.MouseClickedTime[i])
                mouse_earliest_button_down = i;
    }
    bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];
    if (g.CaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.CaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.ActiveId != 0) || (!g.OpenPopupStack.empty());
    g.IO.WantCaptureKeyboard = (g.CaptureKeyboardNextFrame != -1) ? (g.CaptureKeyboardNextFrame != 0) : (g.ActiveId != 0);
    g.IO.WantTextInput = (g.ActiveId != 0 && g.InputTextState.Id == g.ActiveId);
    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.CaptureMouseNextFrame = g.CaptureKeyboardNextFrame = -1;
    g.OsImePosRequest = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    if (!mouse_avail_to_imgui)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Scale & Scrolling
    if (g.HoveredWindow && g.IO.MouseWheel != 0.0f && !g.HoveredWindow->Collapsed)
    {
        ImGuiWindow* window = g.HoveredWindow;
        if (g.IO.KeyCtrl)
        {
            if (g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->PosFloat += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
        }
        else if (!(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
        {
            // Scroll
            const int scroll_lines = (window->Flags & ImGuiWindowFlags_ComboBox) ? 3 : 5;
            SetWindowScrollY(window, window->Scroll.y - g.IO.MouseWheel * window->CalcFontSize() * scroll_lines);
        }
    }

    // Pressing TAB activate widget focus
    // NB: Don't discard FocusedWindow if it isn't active, so that a window that go on/off programatically won't lose its keyboard focus.
    if (g.ActiveId == 0 && g.FocusedWindow != NULL && g.FocusedWindow->Active && IsKeyPressedMap(ImGuiKey_Tab, false))
        g.FocusedWindow->FocusIdxTabRequestNext = 0;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->Accessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.FocusedWindow && !g.FocusedWindow->WasActive)
        for (int i = g.Windows.Size-1; i >= 0; i--)
            if (g.Windows[i]->WasActive && !(g.Windows[i]->Flags & ImGuiWindowFlags_ChildWindow))
            {
                FocusWindow(g.Windows[i]);
                break;
            }

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    CloseInactivePopups();

    // Create implicit window - we will only render it if the user has added something to it.
    ImGui::SetNextWindowSize(ImVec2(400,400), ImGuiSetCond_FirstUseEver);
    ImGui::Begin("Debug");
}